

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<kj::String>::dispose(ArrayBuilder<kj::String> *this)

{
  String *firstElement;
  RemoveConst<kj::String> *pRVar1;
  String *pSVar2;
  String *endCopy;
  String *posCopy;
  String *ptrCopy;
  ArrayBuilder<kj::String> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pSVar2 = this->endPtr;
  if (firstElement != (String *)0x0) {
    this->ptr = (String *)0x0;
    this->pos = (RemoveConst<kj::String> *)0x0;
    this->endPtr = (String *)0x0;
    ArrayDisposer::dispose<kj::String>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x18,
               ((long)pSVar2 - (long)firstElement) / 0x18);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }